

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink7.c
# Opt level: O2

Vec_Int_t * Unm_ManComputePairs(Unm_Man_t *p,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iData1;
  int iVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Hash_IntMan_t *pHash;
  int *piVar5;
  uint uVar6;
  int iVar8;
  Vec_Int_t *pVVar9;
  int in_R8D;
  int i;
  long lVar10;
  int Id;
  int local_60;
  ulong uVar7;
  
  p_00 = Vec_IntAlloc(1000);
  Id = 1;
  iVar8 = 1;
  p_01 = Vec_IntStart(1);
  pHash = Hash_IntManStart(iVar8);
  Gia_ManSetRefsMapped(p->pGia);
  iVar8 = 0;
  local_60 = 0;
  do {
    if (p->pGia->nObjs <= Id) {
      Vec_IntFree(p_01);
      if (fVerbose != 0) {
        Unm_ManPrintPairStats(pHash,local_60,iVar8,p_00->nSize / 3,in_R8D);
      }
      Hash_IntManStop(pHash);
      return p_00;
    }
    iVar1 = Gia_ObjIsLut(p->pGia,Id);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjLutSize(p->pGia,Id);
      iVar2 = Gia_ObjLutSize(p->pGia,Id);
      Gia_ManObj(p->pGia,Id);
      p->vLeaves->nSize = 0;
      for (lVar10 = 0; iVar3 = Gia_ObjLutSize(p->pGia,Id), lVar10 < iVar3; lVar10 = lVar10 + 1) {
        piVar5 = Gia_ObjLutFanins(p->pGia,Id);
        if (1 < p->pGia->pRefs[piVar5[lVar10]]) {
          Vec_IntPush(p->vLeaves,piVar5[lVar10]);
        }
      }
      local_60 = local_60 + ((iVar2 + -1) * iVar1) / 2;
      pVVar9 = p->vLeaves;
      iVar1 = pVVar9->nSize;
      if (1 < iVar1) {
        uVar6 = (uint)((iVar1 + -1) * iVar1) >> 1;
        uVar7 = (ulong)uVar6;
        iVar8 = iVar8 + uVar6;
        iVar2 = 0;
        while (iVar2 < iVar1) {
          iVar3 = Vec_IntEntry(pVVar9,iVar2);
          iVar2 = iVar2 + 1;
          i = iVar2;
          while( true ) {
            pVVar9 = p->vLeaves;
            iVar1 = pVVar9->nSize;
            if (iVar1 <= i) break;
            iData1 = Vec_IntEntry(pVVar9,i);
            iVar1 = iData1;
            if (iVar3 < iData1) {
              iVar1 = iVar3;
            }
            if (iData1 < iVar3) {
              iData1 = iVar3;
            }
            iVar3 = Hash_Int2ManInsert(pHash,iVar1,iData1,(int)uVar7);
            iVar4 = Hash_Int2ObjInc(pHash,iVar3);
            if (iVar4 == 1) {
              if (p_01->nSize <= iVar3) {
                __assert_fail("Num < Vec_IntSize(vNum2Obj)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaShrink7.c"
                              ,0xbf,"Vec_Int_t *Unm_ManComputePairs(Unm_Man_t *, int)");
              }
              iVar3 = Vec_IntEntry(p_01,iVar3);
              Vec_IntPush(p_00,iVar3);
              Vec_IntPush(p_00,iVar1);
              Vec_IntPush(p_00,iData1);
LAB_005f966c:
              Vec_IntPush(p_00,Id);
              Vec_IntPush(p_00,iVar1);
              pVVar9 = p_00;
            }
            else {
              if (iVar4 != 0) goto LAB_005f966c;
              uVar7 = 4;
              if (iVar3 != pHash->vObjs->nSize / 4 + -1) {
                __assert_fail("Num == Hash_IntManEntryNum(pHash)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaShrink7.c"
                              ,0xb8,"Vec_Int_t *Unm_ManComputePairs(Unm_Man_t *, int)");
              }
              pVVar9 = p_01;
              iData1 = Id;
              if (iVar3 != p_01->nSize) {
                __assert_fail("Num == Vec_IntSize(vNum2Obj)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaShrink7.c"
                              ,0xb9,"Vec_Int_t *Unm_ManComputePairs(Unm_Man_t *, int)");
              }
            }
            Vec_IntPush(pVVar9,iData1);
            i = i + 1;
            iVar3 = iVar1;
          }
        }
      }
    }
    Id = Id + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Unm_ManComputePairs( Unm_Man_t * p, int fVerbose )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vPairs = Vec_IntAlloc( 1000 );
    Vec_Int_t * vNum2Obj = Vec_IntStart( 1 );
    Hash_IntMan_t * pHash = Hash_IntManStart( 1000 );
    int nTotal = 0, nPairs0 = 0, nPairs = 0;
    int i, k, j, FanK, FanJ, Num, nRefs;
    Gia_ManSetRefsMapped( p->pGia );
    Gia_ManForEachLut( p->pGia, i )
    {
        nTotal += Gia_ObjLutSize(p->pGia, i) * (Gia_ObjLutSize(p->pGia, i) - 1) / 2;
        pObj = Gia_ManObj( p->pGia, i );
        // collect leaves of this gate  
        Vec_IntClear( p->vLeaves );
        Gia_LutForEachFanin( p->pGia, i, Num, k )
            if ( Gia_ObjRefNumId(p->pGia, Num) > 1 )
                Vec_IntPush( p->vLeaves, Num );
        if ( Vec_IntSize(p->vLeaves) < 2 )
            continue;
        nPairs0 += Vec_IntSize(p->vLeaves) * (Vec_IntSize(p->vLeaves) - 1) / 2;
        // enumerate pairs
        Vec_IntForEachEntry( p->vLeaves, FanK, k )
        Vec_IntForEachEntryStart( p->vLeaves, FanJ, j, k+1 )
        {
            if ( FanK > FanJ )
                ABC_SWAP( int, FanK, FanJ );
            Num = Hash_Int2ManInsert( pHash, FanK, FanJ, 0 );
            nRefs = Hash_Int2ObjInc(pHash, Num);
            if ( nRefs == 0 )
            {
                assert( Num == Hash_IntManEntryNum(pHash) );
                assert( Num == Vec_IntSize(vNum2Obj) );
                Vec_IntPush( vNum2Obj, i );
                continue;
            }
            if ( nRefs == 1 )
            {
                assert( Num < Vec_IntSize(vNum2Obj) );
                Vec_IntPush( vPairs, Vec_IntEntry(vNum2Obj, Num) );
                Vec_IntPush( vPairs, FanK );
                Vec_IntPush( vPairs, FanJ);
            }
            Vec_IntPush( vPairs, i );
            Vec_IntPush( vPairs, FanK );
            Vec_IntPush( vPairs, FanJ );
        }
    }
    Vec_IntFree( vNum2Obj );
    if ( fVerbose )
        nPairs = Unm_ManPrintPairStats( pHash, nTotal, nPairs0, Vec_IntSize(vPairs) / 3, 0 );
    Hash_IntManStop( pHash );
    return vPairs;    
}